

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer_sink.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
spdlog::sinks::ringbuffer_sink<std::mutex>::last_formatted_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,ringbuffer_sink<std::mutex> *this,size_t lim)

{
  mutex *__mutex;
  size_type *psVar1;
  ulong uVar2;
  formatter *pfVar3;
  size_t sVar4;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf;
  ulong uVar5;
  memory_buf_t formatted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_150;
  
  __mutex = &(this->super_base_sink<std::mutex>).mutex_;
  std::mutex::lock(__mutex);
  uVar2 = (this->q_).tail_;
  psVar1 = &(this->q_).head_;
  if (uVar2 < *psVar1) {
    sVar4 = (this->q_).max_items_;
  }
  else {
    sVar4 = 0;
  }
  uVar2 = sVar4 + (uVar2 - *psVar1);
  uVar5 = lim;
  if (uVar2 < lim) {
    uVar5 = uVar2;
  }
  if (lim == 0) {
    uVar5 = uVar2;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,uVar5);
  for (uVar5 = uVar2 - uVar5; uVar5 < uVar2; uVar5 = uVar5 + 1) {
    local_150.super_buffer<char>.size_ = 0;
    local_150.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0031f558;
    local_150.super_buffer<char>.ptr_ = local_150.store_;
    local_150.super_buffer<char>.capacity_ = 0xfa;
    pfVar3 = (this->super_base_sink<std::mutex>).formatter_._M_t.
             super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
             super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
             super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
    (*pfVar3->_vptr_formatter[2])
              (pfVar3,(this->q_).v_.
                      super__Vector_base<spdlog::details::log_msg_buffer,_std::allocator<spdlog::details::log_msg_buffer>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                      ((this->q_).head_ + uVar5) % (this->q_).max_items_,&local_150);
    ::fmt::v7::to_string<char,250ul>(&local_170,(v7 *)&local_150,buf);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (&local_150);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> last_formatted(size_t lim = 0)
    {
        std::lock_guard<Mutex> lock(base_sink<Mutex>::mutex_);
        auto items_available = q_.size();
        auto n_items = lim > 0 ? (std::min)(lim, items_available) : items_available;
        std::vector<std::string> ret;
        ret.reserve(n_items);
        for (size_t i = (items_available - n_items); i < items_available; i++)
        {
            memory_buf_t formatted;
            base_sink<Mutex>::formatter_->format(q_.at(i), formatted);
            ret.push_back(fmt::to_string(formatted));
        }
        return ret;
    }